

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void multi_thread_server(int port,string *ip,string *log_file)

{
  int sockfd;
  Pass2thread *this;
  int _idx;
  pthread_t tid;
  string local_80;
  undefined1 local_60 [48];
  
  _idx = 1;
  sockfd = C_std::Network::Socket(2,1,0);
  std::__cxx11::string::string((string *)&local_80,(string *)ip);
  C_std::Network::easy_bind(sockfd,port,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  C_std::Network::Listen(sockfd,0x80);
  do {
    this = (Pass2thread *)operator_new(0x68);
    C_std::Network::easy_accept((client_socket *)local_60,sockfd);
    Pass2thread::Pass2thread(this,(client_socket *)local_60,log_file,_idx);
    std::__cxx11::string::~string((string *)(local_60 + 8));
    POSIX::multithreading::Pthread_create(&tid,(pthread_attr_t *)0x0,start_routine,this);
    POSIX::multithreading::Pthread_detach(tid);
    _idx = _idx + 1;
  } while( true );
}

Assistant:

void multi_thread_server(int port, const std::string &ip, const std::string &log_file) {
    using namespace POSIX::multithreading;
    int client_num = 0;

    int listened_sockfd = Socket(AF_INET, SOCK_STREAM, 0);
    easy_bind(listened_sockfd, port, ip);
    Listen(listened_sockfd, 128);
    while (1) {
        ++client_num;
        Pass2thread *arg = new Pass2thread(easy_accept(listened_sockfd), log_file, client_num);
        pthread_t tid;
        Pthread_create(&tid, 0, start_routine, arg);
        Pthread_detach(tid);
    }
}